

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

CNode * __thiscall CConnman::FindNode(CConnman *this,CService *addr)

{
  long lVar1;
  bool bVar2;
  reference ppCVar3;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_RSI;
  CService *in_RDI;
  long in_FS_OFFSET;
  CNode *pnode;
  vector<CNode_*,_std::allocator<CNode_*>_> *__range1;
  iterator __end1;
  iterator __begin1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock25;
  CService *in_stack_ffffffffffffff58;
  CService *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  byte in_stack_ffffffffffffff6f;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  char *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffff90;
  CNode *local_58;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff58);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_RSI,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff7c,SUB41((uint)in_stack_ffffffffffffff78 >> 0x18,0));
  std::vector<CNode_*,_std::allocator<CNode_*>_>::begin
            ((vector<CNode_*,_std::allocator<CNode_*>_> *)in_stack_ffffffffffffff60);
  std::vector<CNode_*,_std::allocator<CNode_*>_>::end
            ((vector<CNode_*,_std::allocator<CNode_*>_> *)in_stack_ffffffffffffff60);
  while (bVar2 = __gnu_cxx::operator==<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                           ((__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                             *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                            (__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                             *)in_stack_ffffffffffffff60), ((bVar2 ^ 0xffU) & 1) != 0) {
    ppCVar3 = __gnu_cxx::
              __normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>::
              operator*((__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                         *)in_stack_ffffffffffffff58);
    local_58 = *ppCVar3;
    CService::CService((CService *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                       in_stack_ffffffffffffff60);
    in_stack_ffffffffffffff6f =
         ::operator==((CService *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                      in_RDI);
    CService::~CService(in_stack_ffffffffffffff58);
    if ((in_stack_ffffffffffffff6f & 1) != 0) goto LAB_00ff6403;
    __gnu_cxx::__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>::
    operator++((__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_> *)
               in_stack_ffffffffffffff58);
  }
  local_58 = (CNode *)0x0;
LAB_00ff6403:
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff58);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_58;
}

Assistant:

CNode* CConnman::FindNode(const CService& addr)
{
    LOCK(m_nodes_mutex);
    for (CNode* pnode : m_nodes) {
        if (static_cast<CService>(pnode->addr) == addr) {
            return pnode;
        }
    }
    return nullptr;
}